

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrototypeChainCache.cpp
# Opt level: O0

void __thiscall
Js::PrototypeChainCache<Js::NoSpecialPropertyCache>::Register
          (PrototypeChainCache<Js::NoSpecialPropertyCache> *this,Type *type)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  undefined4 *puVar5;
  ScriptContext *pSVar6;
  ScriptCacheRegistry<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_> *pSVar7;
  ScriptContext *pSVar8;
  Type *local_18;
  Type *type_local;
  PrototypeChainCache<Js::NoSpecialPropertyCache> *this_local;
  
  local_18 = type;
  type_local = (Type *)this;
  if (type == (Type *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/PrototypeChainCache.cpp"
                                ,0x86,"(type)","type");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  pSVar6 = Js::Type::GetScriptContext(local_18);
  pSVar7 = Memory::
           WriteBarrierPtr<Js::ScriptCacheRegistry<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_>_>
           ::operator->(&this->scriptRegistry);
  pSVar8 = ScriptCacheRegistry<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_>::
           GetScriptContext(pSVar7);
  if (pSVar6 != pSVar8) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/PrototypeChainCache.cpp"
                                ,0x87,
                                "(type->GetScriptContext() == scriptRegistry->GetScriptContext())",
                                "type->GetScriptContext() == scriptRegistry->GetScriptContext()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  pSVar7 = Memory::
           WriteBarrierPtr<Js::ScriptCacheRegistry<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_>_>
           ::operator->(&this->scriptRegistry);
  pSVar6 = ScriptCacheRegistry<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_>::
           GetScriptContext(pSVar7);
  uVar3 = (*(pSVar6->super_ScriptContextInfo)._vptr_ScriptContextInfo[0x24])();
  if ((uVar3 & 1) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/PrototypeChainCache.cpp"
                                ,0x88,"(!scriptRegistry->GetScriptContext()->IsClosed())",
                                "!scriptRegistry->GetScriptContext()->IsClosed()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  NoSpecialPropertyCache::RegistrationAssert(local_18);
  iVar4 = JsUtil::ReadOnlyList<Js::Type_*,_Memory::Recycler,_DefaultComparer>::Count
                    ((ReadOnlyList<Js::Type_*,_Memory::Recycler,_DefaultComparer> *)this);
  if (iVar4 == 0) {
    pSVar7 = Memory::
             WriteBarrierPtr<Js::ScriptCacheRegistry<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_>_>
             ::operator->(&this->scriptRegistry);
    ScriptCacheRegistry<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_>::Register(pSVar7);
  }
  JsUtil::List<Js::Type_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>::Add
            (&this->types,&local_18);
  return;
}

Assistant:

void
PrototypeChainCache<T>::Register(_In_ Type* type)
{
    Assert(type);
    Assert(type->GetScriptContext() == scriptRegistry->GetScriptContext());
    Assert(!scriptRegistry->GetScriptContext()->IsClosed());
#if DBG
    T::RegistrationAssert(type);
#endif

    if (this->types.Count() == 0)
    {
        this->scriptRegistry->Register();
    }
    this->types.Add(type);
}